

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O2

REF_STATUS ref_matrix_orthog(REF_INT n,REF_DBL *a)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  REF_DBL *pRVar6;
  ulong uVar7;
  REF_DBL *pRVar8;
  double dVar9;
  
  lVar1 = (long)n;
  uVar4 = 0;
  if (0 < n) {
    uVar4 = (ulong)(uint)n;
  }
  iVar5 = 1;
  uVar3 = 0;
  pRVar6 = a;
  do {
    if (uVar3 == uVar4) {
      return 0;
    }
    lVar2 = (long)iVar5;
    pRVar8 = (REF_DBL *)(lVar1 * 8 * lVar2 + (long)a);
    uVar3 = uVar3 + 1;
    for (; lVar2 < lVar1; lVar2 = lVar2 + 1) {
      dVar9 = 0.0;
      for (uVar7 = 0; (uint)n != uVar7; uVar7 = uVar7 + 1) {
        dVar9 = dVar9 + pRVar6[uVar7] * pRVar8[uVar7];
      }
      if (dVar9 <= -dVar9) {
        dVar9 = -dVar9;
      }
      if (1e-13 < dVar9) {
        printf(" %d-%d not orthog: %e\n");
        printf(" %f %f %f\n",*a,a[3],a[6]);
        printf(" %f %f %f\n",a[1],a[4],a[7]);
        printf(" %f %f %f\n",a[2],a[5],a[8]);
        return 3;
      }
      pRVar8 = pRVar8 + lVar1;
    }
    iVar5 = iVar5 + 1;
    pRVar6 = pRVar6 + lVar1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_matrix_orthog(REF_INT n, REF_DBL *a) {
  REF_INT i, j, k;
  REF_DBL norm;

  for (i = 0; i < n; i++)
    for (j = i + 1; j < n; j++) {
      norm = 0.0;
      for (k = 0; k < n; k++) norm += a[k + n * i] * a[k + n * j];
      if (ABS(norm) > 1.0e-13) {
        printf(" %d-%d not orthog: %e\n", i, j, norm);
        printf(" %f %f %f\n", a[0], a[3], a[6]);
        printf(" %f %f %f\n", a[1], a[4], a[7]);
        printf(" %f %f %f\n", a[2], a[5], a[8]);
        return REF_INVALID;
      }
    }

  return REF_SUCCESS;
}